

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::updateStandaloneQualifierDefaults
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  EShLanguage EVar1;
  int iVar2;
  TLayoutGeometry TVar3;
  TLayoutGeometry TVar4;
  TVertexSpacing TVar5;
  TVertexSpacing TVar6;
  TVertexOrder TVar7;
  TVertexOrder TVar8;
  TInterlockOrdering TVar9;
  TInterlockOrdering TVar10;
  TIntermediate *pTVar11;
  pointer pTVar12;
  int iVar13;
  long lVar14;
  undefined4 extraout_var;
  long *plVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  uint uVar21;
  char *pcVar22;
  _func_int **pp_Var23;
  TString maxsErrtring;
  
  if ((publicType->shaderQualifiers).vertices != -1) {
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
    if ((EShLangMesh < EVar1) || ((0x200aU >> (EVar1 & 0x1f) & 1) == 0)) {
      __assert_fail("language == EShLangTessControl || language == EShLangGeometry || language == EShLangMesh"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x2743,
                    "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                   );
    }
    pcVar19 = "max_vertices";
    if (EVar1 == EShLangTessControl) {
      pcVar19 = "vertices";
    }
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'out\'",pcVar19,"");
    }
    pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar13 = (publicType->shaderQualifiers).vertices;
    iVar2 = pTVar11->vertices;
    if (iVar2 == -1) {
      pTVar11->vertices = iVar13;
    }
    else if (iVar2 != iVar13) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value",pcVar19,"");
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
      checkIoArraysConsistency(this,loc,false);
    }
  }
  if ((publicType->shaderQualifiers).primitives != -1) {
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
      __assert_fail("language == EShLangMesh",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x274f,
                    "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                   );
    }
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'out\'","max_primitives","");
    }
    pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar13 = (publicType->shaderQualifiers).primitives;
    iVar2 = pTVar11->primitives;
    if (iVar2 == -1) {
      pTVar11->primitives = iVar13;
    }
    else if (iVar2 != iVar13) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","max_primitives","");
    }
  }
  if ((publicType->shaderQualifiers).invocations != -1) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","invocations","");
    }
    pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar13 = (publicType->shaderQualifiers).invocations;
    iVar2 = pTVar11->invocations;
    if (iVar2 == -1) {
      pTVar11->invocations = iVar13;
    }
    else if (iVar2 != iVar13) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","invocations","");
    }
  }
  TVar3 = (publicType->shaderQualifiers).geometry;
  lVar14 = (long)(int)TVar3;
  if (lVar14 == 0) goto LAB_004c3c85;
  uVar16 = (uint)*(undefined8 *)&(publicType->qualifier).field_0x8;
  uVar21 = uVar16 & 0x7f;
  if (uVar21 != 4) {
    if (uVar21 == 3) {
      if (TVar3 < (ElgQuads|ElgLines)) {
        if ((0x36eU >> (TVar3 & 0x1f) & 1) == 0) {
          if (TVar3 == ElgLineStrip) {
            pcVar19 = "line_strip";
          }
          else {
            if (TVar3 != ElgTriangleStrip) goto LAB_004c3bde;
            pcVar19 = "triangle_strip";
          }
          goto LAB_004c3c22;
        }
        EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
        if (EVar1 == EShLangMesh) {
          if (ElgIsolines < TVar3) goto LAB_004c3bde;
          pcVar19 = *(char **)(&DAT_00b10a08 + lVar14 * 8);
          goto LAB_004c3c22;
        }
        pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar4 = pTVar11->inputPrimitive;
        if (TVar4 == ElgNone) {
          pTVar11->inputPrimitive = TVar3;
LAB_004c3bf8:
          if (EVar1 == EShLangGeometry) {
            checkIoArraysConsistency(this,loc,false);
          }
          goto LAB_004c3c85;
        }
        if (TVar4 == TVar3) goto LAB_004c3bf8;
        if (TVar3 < (ElgQuads|ElgLines)) {
          pcVar19 = *(char **)(&DAT_00b10a08 + lVar14 * 8);
        }
        else {
          pcVar19 = "none";
        }
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar18 = "cannot change previously set input primitive";
      }
      else {
LAB_004c3bde:
        pcVar19 = "none";
LAB_004c3c22:
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar18 = "cannot apply to input";
      }
      goto LAB_004c3c6d;
    }
    if (TVar3 < (ElgQuads|ElgLines)) {
      pcVar19 = *(char **)(&DAT_00b10a08 + lVar14 * 8);
    }
    else {
      pcVar19 = "none";
    }
    if (uVar21 < 0x1f) {
      pcVar22 = (&PTR_anon_var_dwarf_1071bf9_00b10a58)[uVar16 & 0x7f];
    }
    else {
      pcVar22 = "unknown qualifier";
    }
    pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar18 = "cannot apply to:";
    goto LAB_004c3c74;
  }
  switch(TVar3) {
  case ElgPoints:
  case ElgLineStrip:
  case ElgTriangleStrip:
    goto switchD_004c3b19_caseD_1;
  case ElgLines:
  case ElgTriangles:
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
      if (ElgIsolines < TVar3) goto switchD_004c3b19_default;
      pcVar19 = *(char **)(&DAT_00b10a08 + lVar14 * 8);
      break;
    }
switchD_004c3b19_caseD_1:
    pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar4 = pTVar11->outputPrimitive;
    if (TVar4 != ElgNone) {
      if (TVar4 == TVar3) goto LAB_004c3c85;
      if (TVar3 < (ElgQuads|ElgLines)) {
        pcVar19 = *(char **)(&DAT_00b10a08 + lVar14 * 8);
      }
      else {
        pcVar19 = "none";
      }
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar18 = "cannot change previously set output primitive";
      goto LAB_004c3c6d;
    }
    pTVar11->outputPrimitive = TVar3;
    goto LAB_004c3c85;
  case ElgLinesAdjacency:
    pcVar19 = "lines_adjacency";
    break;
  case ElgTrianglesAdjacency:
    pcVar19 = "triangles_adjacency";
    break;
  case ElgQuads:
    pcVar19 = "quads";
    break;
  case ElgIsolines:
    pcVar19 = "isolines";
    break;
  default:
switchD_004c3b19_default:
    pcVar19 = "none";
  }
  pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar18 = "cannot apply to \'out\'";
LAB_004c3c6d:
  pcVar22 = "";
LAB_004c3c74:
  (*pp_Var23[0x2d])(this,loc,pcVar18,pcVar19,pcVar22);
LAB_004c3c85:
  TVar5 = (publicType->shaderQualifiers).spacing;
  lVar14 = (long)(int)TVar5;
  if (lVar14 != 0) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar6 = pTVar11->vertexSpacing;
      if (TVar6 == EvsNone) {
        pTVar11->vertexSpacing = TVar5;
      }
      else if (TVar6 != TVar5) {
        if (TVar5 < 4) {
          pcVar19 = *(char **)(&DAT_00b10b48 + lVar14 * 8);
        }
        else {
          pcVar19 = "none";
        }
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar18 = "cannot change previously set vertex spacing";
        goto LAB_004c3d02;
      }
    }
    else {
      if (TVar5 < 4) {
        pcVar19 = *(char **)(&DAT_00b10b48 + lVar14 * 8);
      }
      else {
        pcVar19 = "none";
      }
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar18 = "can only apply to \'in\'";
LAB_004c3d02:
      (*pp_Var23[0x2d])(this,loc,pcVar18,pcVar19,"");
    }
  }
  TVar7 = (publicType->shaderQualifiers).order;
  if (TVar7 != EvoNone) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar8 = pTVar11->vertexOrder;
      if (TVar8 == EvoNone) {
        pTVar11->vertexOrder = TVar7;
      }
      else if (TVar8 != TVar7) {
        pcVar19 = "none";
        if (TVar7 == EvoCcw) {
          pcVar19 = "ccw";
        }
        pcVar18 = "cw";
        if (TVar7 != EvoCw) {
          pcVar18 = pcVar19;
        }
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar19 = "cannot change previously set vertex order";
        goto LAB_004c3da0;
      }
    }
    else {
      pcVar19 = "none";
      if (TVar7 == EvoCcw) {
        pcVar19 = "ccw";
      }
      pcVar18 = "cw";
      if (TVar7 != EvoCw) {
        pcVar18 = pcVar19;
      }
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar19 = "can only apply to \'in\'";
LAB_004c3da0:
      (*pp_Var23[0x2d])(this,loc,pcVar19,pcVar18,"");
    }
  }
  if ((publicType->shaderQualifiers).pointMode == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->pointMode = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","point_mode","");
    }
  }
  uVar20 = 0;
  do {
    if ((publicType->shaderQualifiers).localSizeNotDefault[uVar20] == true) {
      if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
        pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar13 = (publicType->shaderQualifiers).localSize[uVar20];
        if (pTVar11->localSizeNotDefault[uVar20] != true) {
          pTVar11->localSizeNotDefault[uVar20] = true;
          pTVar11->localSize[uVar20] = iVar13;
LAB_004c3ea3:
          EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
          if (EVar1 == EShLangMesh) {
            (*(code *)(&DAT_0089aad0 + *(int *)(&DAT_0089aad0 + (uVar20 & 0xffffffff) * 4)))();
            return;
          }
          if (EVar1 != EShLangTask) {
            if (EVar1 == EShLangCompute) {
              (*(code *)(&DAT_0089aae0 + *(int *)(&DAT_0089aae0 + (uVar20 & 0xffffffff) * 4)))();
              return;
            }
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x27e1,
                          "void glslang::TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                         );
          }
          (*(code *)(&DAT_0089aac0 + *(int *)(&DAT_0089aac0 + (uVar20 & 0xffffffff) * 4)))();
          return;
        }
        if (pTVar11->localSize[uVar20] == iVar13) goto LAB_004c3ea3;
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar19 = "cannot change previously set size";
      }
      else {
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar19 = "can only apply to \'in\'";
      }
      (*pp_Var23[0x2d])(this,loc,pcVar19,"local_size","");
    }
    iVar13 = (publicType->shaderQualifiers).localSizeSpecId[uVar20];
    if (iVar13 != -1) {
      if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
        pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar2 = pTVar11->localSizeSpecId[uVar20];
        if (iVar2 == -1) {
          pTVar11->localSizeSpecId[uVar20] = iVar13;
        }
        else if (iVar2 != iVar13) {
          pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar18 = "cannot change previously set size";
          pcVar19 = "local_size";
          goto LAB_004c41ad;
        }
      }
      else {
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar18 = "can only apply to \'in\'";
        pcVar19 = "local_size id";
LAB_004c41ad:
        (*pp_Var23[0x2d])(this,loc,pcVar18,pcVar19,"");
      }
      iVar13 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                         (this,"gl_WorkGroupSize");
      plVar15 = (long *)CONCAT44(extraout_var,iVar13);
      if (plVar15 != (long *)0x0) {
        plVar15 = (long *)(**(code **)(*plVar15 + 0x68))(plVar15);
        lVar14 = (**(code **)(*plVar15 + 0x50))(plVar15);
        *(byte *)(lVar14 + 0xc) = *(byte *)(lVar14 + 0xc) | 1;
      }
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 != 3);
  if ((publicType->shaderQualifiers).earlyFragmentTests != false) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->earlyFragmentTests = true
      ;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","early_fragment_tests","");
    }
  }
  if ((publicType->shaderQualifiers).earlyAndLateFragmentTestsAMD == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      earlyAndLateFragmentTestsAMD = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","early_and_late_fragment_tests_amd","");
    }
  }
  if ((publicType->shaderQualifiers).postDepthCoverage == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->postDepthCoverage = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","post_coverage_coverage","");
    }
  }
  if ((publicType->shaderQualifiers).nonCoherentColorAttachmentReadEXT == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      nonCoherentColorAttachmentReadEXT = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_color_attachment_readEXT","");
    }
  }
  if ((publicType->shaderQualifiers).nonCoherentDepthAttachmentReadEXT == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      nonCoherentDepthAttachmentReadEXT = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_depth_attachment_readEXT","");
    }
  }
  if ((publicType->shaderQualifiers).nonCoherentStencilAttachmentReadEXT == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
      nonCoherentStencilAttachmentReadEXT = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to \'in\'","non_coherent_stencil_attachment_readEXT","");
    }
  }
  if (((publicType->shaderQualifiers).blendEquation == true) &&
     ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) != 4)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to \'out\'","blend equation","");
  }
  TVar9 = (publicType->shaderQualifiers).interlockOrdering;
  lVar14 = (long)(int)TVar9;
  if (lVar14 != 0) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar10 = pTVar11->interlockOrdering;
      if (TVar10 == EioNone) {
        pTVar11->interlockOrdering = TVar9;
      }
      else if (TVar10 != TVar9) {
        if (TVar9 < EioCount) {
          pcVar19 = *(char **)(&DAT_00b10b60 + lVar14 * 8);
        }
        else {
          pcVar19 = "none";
        }
        pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar18 = "cannot change previously set fragment shader interlock ordering";
        goto LAB_004c4484;
      }
    }
    else {
      if (TVar9 < EioCount) {
        pcVar19 = *(char **)(&DAT_00b10b60 + lVar14 * 8);
      }
      else {
        pcVar19 = "none";
      }
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar18 = "can only apply to \'in\'";
LAB_004c4484:
      (*pp_Var23[0x2d])(this,loc,pcVar18,pcVar19,"");
    }
  }
  if (((publicType->shaderQualifiers).layoutDerivativeGroupQuads == true) &&
     ((publicType->shaderQualifiers).layoutDerivativeGroupLinear == true)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot be both specified",
               "derivative_group_quadsNV and derivative_group_linearNV","");
  }
  if ((publicType->shaderQualifiers).layoutDerivativeGroupQuads == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (((pTVar11->localSizeSpecId[0] != -1) || ((pTVar11->localSize[0] & 1) == 0)) &&
         ((pTVar11->localSizeSpecId[1] != -1 || ((pTVar11->localSize[1] & 1) == 0)))) {
        pTVar11->computeDerivativeMode = LayoutDerivativeGroupQuads;
        goto LAB_004c4558;
      }
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar19 = "requires local_size_x and local_size_y to be multiple of two";
    }
    else {
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar19 = "can only apply to \'in\'";
    }
    (*pp_Var23[0x2d])(this,loc,pcVar19,"derivative_group_quadsNV","");
  }
LAB_004c4558:
  if ((publicType->shaderQualifiers).layoutDerivativeGroupLinear == true) {
    if ((*(uint *)&(publicType->qualifier).field_0x8 & 0x7f) == 3) {
      pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if ((((pTVar11->localSizeSpecId[0] != -1) || (pTVar11->localSizeSpecId[1] != -1)) ||
          (pTVar11->localSizeSpecId[2] != -1)) ||
         ((pTVar11->localSize[1] * pTVar11->localSize[0] * pTVar11->localSize[2] & 3U) == 0)) {
        pTVar11->computeDerivativeMode = LayoutDerivativeGroupLinear;
        goto LAB_004c45c6;
      }
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar19 = "requires total group size to be multiple of four";
    }
    else {
      pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar19 = "can only apply to \'in\'";
    }
    (*pp_Var23[0x2d])(this,loc,pcVar19,"derivative_group_linearNV","");
  }
LAB_004c45c6:
  if ((((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) &&
      (pTVar11 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
      pTVar11->vertices != -1)) &&
     ((pTVar11->primitives != -1 && (pTVar11->outputPrimitive != ElgNone)))) {
    checkIoArraysConsistency(this,loc,false);
  }
  if ((publicType->shaderQualifiers).layoutPrimitiveCulling == true) {
    if (((publicType->qualifier).field_0x8 & 0x7f) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"layout qualifier cannot have storage qualifiers","primitive_culling","",
                 "");
      return;
    }
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->layoutPrimitiveCulling =
         true;
    return;
  }
  if (((*(ulong *)&(publicType->qualifier).field_0x8 & 0x3fff1e0e0000000) != 0) ||
     (((publicType->qualifier).field_0xb & 0xe) != 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "cannot use auxiliary, memory, interpolation, or precision qualifier in a default qualifier declaration (declaration with no type)"
               ,"qualifier","");
  }
  if (((publicType->qualifier).layoutOffset != -1) || ((publicType->qualifier).layoutAlign != -1)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "cannot use offset or align qualifiers in a default qualifier declaration (declaration with no type)"
               ,"layout qualifier","");
  }
  layoutQualifierCheck(this,loc,&publicType->qualifier);
  uVar20 = *(ulong *)&(publicType->qualifier).field_0x8;
  switch((uint)uVar20 & 0x7f) {
  case 3:
    break;
  case 4:
    if ((publicType->qualifier).field_0x23 != -1) {
      *(ulong *)&(this->globalOutputDefaults).field_0x1c =
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xffffffffffffff |
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xff00000000000000;
    }
    if ((~*(uint *)&(publicType->qualifier).field_0x24 & 0xf) != 0) {
      *(ulong *)&(this->globalOutputDefaults).field_0x24 =
           *(ulong *)&(this->globalOutputDefaults).field_0x24 & 0xfffffffffffffff0 |
           (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf);
    }
    if (((~*(uint *)&(this->globalOutputDefaults).field_0x24 & 0xf) != 0) &&
       ((~*(uint *)&(publicType->qualifier).field_0x24 & 0x3fff0) != 0)) {
      uVar17 = (uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf;
      uVar21 = *(uint *)&(publicType->qualifier).field_0x24 >> 4 & 0x3fff;
      pTVar12 = (((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbBuffers).
                super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar16 = pTVar12[uVar17].stride;
      if (uVar16 == 0x3fff) {
        pTVar12[uVar17].stride = uVar21;
      }
      else if (uVar16 != uVar21) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"all stride settings must match for xfb buffer","xfb_stride","%d",
                   (ulong)(*(uint *)&(publicType->qualifier).field_0x24 & 0xf));
      }
    }
    break;
  case 5:
    if (*(ulong *)&(publicType->qualifier).field_0x8 >> 0x3d != 0) {
      *(ulong *)&(this->globalUniformDefaults).field_0x8 =
           *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar20 & 0xe000000000000000;
    }
    if (((publicType->qualifier).field_0x10 & 0xf) != 0) {
      (this->globalUniformDefaults).field_0x10 =
           (this->globalUniformDefaults).field_0x10 & 0xf0 |
           (publicType->qualifier).field_0x10 & 0xf;
    }
    break;
  case 6:
    if (*(ulong *)&(publicType->qualifier).field_0x8 >> 0x3d != 0) {
      *(ulong *)&(this->globalBufferDefaults).field_0x8 =
           *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar20 & 0xe000000000000000;
    }
    if (((publicType->qualifier).field_0x10 & 0xf) != 0) {
      (this->globalBufferDefaults).field_0x10 =
           (this->globalBufferDefaults).field_0x10 & 0xf0 | (publicType->qualifier).field_0x10 & 0xf
      ;
    }
    break;
  case 7:
    if (*(ulong *)&(publicType->qualifier).field_0x8 >> 0x3d != 0) {
      *(ulong *)&(this->globalSharedDefaults).field_0x8 =
           *(ulong *)&(this->globalSharedDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar20 & 0xe000000000000000;
    }
    if (((publicType->qualifier).field_0x10 & 0xf) != 0) {
      (this->globalSharedDefaults).field_0x10 =
           (this->globalSharedDefaults).field_0x10 & 0xf0 | (publicType->qualifier).field_0x10 & 0xf
      ;
    }
    break;
  default:
    pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar18 = 
    "default qualifier requires \'uniform\', \'buffer\', \'in\', \'out\' or \'shared\' storage qualification"
    ;
    pcVar19 = "";
    goto LAB_004c4a57;
  }
  if ((short)((ulong)*(undefined8 *)&(publicType->qualifier).field_0x1c >> 0x20) != -1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, include a type or full declaration","binding","")
    ;
  }
  if ((*(ulong *)&(publicType->qualifier).field_0x1c & 0xff000000007fff) != 0xff000000004fff) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, use a full declaration",
               "location/component/index","");
  }
  if ((~*(uint *)&(publicType->qualifier).field_0x24 & 0x7ffc0000) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, use a full declaration","xfb_offset","");
  }
  if ((publicType->qualifier).layoutPushConstant == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, can only be used on a block","push_constant","");
  }
  if ((publicType->qualifier).layoutBufferReference == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, can only be used on a block","buffer_reference",
               "");
  }
  if ((~*(ulong *)&(publicType->qualifier).field_0x24 & 0x7ff0000000000) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot declare a default, can only be used on a scalar","constant_id","");
  }
  if ((publicType->qualifier).layoutShaderRecord == true) {
    pp_Var23 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar18 = "cannot declare a default, can only be used on a block";
    pcVar19 = "shaderRecordNV";
LAB_004c4a57:
    (*pp_Var23[0x2d])(this,loc,pcVar18,pcVar19,"");
  }
  return;
}

Assistant:

void TParseContext::updateStandaloneQualifierDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        assert(language == EShLangTessControl || language == EShLangGeometry || language == EShLangMesh);
        const char* id = (language == EShLangTessControl) ? "vertices" : "max_vertices";

        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", id, "");
        if (! intermediate.setVertices(publicType.shaderQualifiers.vertices))
            error(loc, "cannot change previously set layout value", id, "");

        if (language == EShLangTessControl)
            checkIoArraysConsistency(loc);
    }
    if (publicType.shaderQualifiers.primitives != TQualifier::layoutNotSet) {
        assert(language == EShLangMesh);
        const char* id = "max_primitives";

        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", id, "");
        if (! intermediate.setPrimitives(publicType.shaderQualifiers.primitives))
            error(loc, "cannot change previously set layout value", id, "");
    }
    if (publicType.shaderQualifiers.invocations != TQualifier::layoutNotSet) {
        if (publicType.qualifier.storage != EvqVaryingIn)
            error(loc, "can only apply to 'in'", "invocations", "");
        if (! intermediate.setInvocations(publicType.shaderQualifiers.invocations))
            error(loc, "cannot change previously set layout value", "invocations", "");
    }
    if (publicType.shaderQualifiers.geometry != ElgNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgPoints:
            case ElgLines:
            case ElgLinesAdjacency:
            case ElgTriangles:
            case ElgTrianglesAdjacency:
            case ElgQuads:
            case ElgIsolines:
                if (language == EShLangMesh) {
                    error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                    break;
                }
                if (intermediate.setInputPrimitive(publicType.shaderQualifiers.geometry)) {
                    if (language == EShLangGeometry)
                        checkIoArraysConsistency(loc);
                } else
                    error(loc, "cannot change previously set input primitive", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                break;
            default:
                error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
            }
        } else if (publicType.qualifier.storage == EvqVaryingOut) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgLines:
            case ElgTriangles:
                if (language != EShLangMesh) {
                    error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                    break;
                }
                [[fallthrough]];
            case ElgPoints:
            case ElgLineStrip:
            case ElgTriangleStrip:
                if (! intermediate.setOutputPrimitive(publicType.shaderQualifiers.geometry))
                    error(loc, "cannot change previously set output primitive", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
                break;
            default:
                error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), "");
            }
        } else
            error(loc, "cannot apply to:", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry), GetStorageQualifierString(publicType.qualifier.storage));
    }
    if (publicType.shaderQualifiers.spacing != EvsNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (! intermediate.setVertexSpacing(publicType.shaderQualifiers.spacing))
                error(loc, "cannot change previously set vertex spacing", TQualifier::getVertexSpacingString(publicType.shaderQualifiers.spacing), "");
        } else
            error(loc, "can only apply to 'in'", TQualifier::getVertexSpacingString(publicType.shaderQualifiers.spacing), "");
    }
    if (publicType.shaderQualifiers.order != EvoNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (! intermediate.setVertexOrder(publicType.shaderQualifiers.order))
                error(loc, "cannot change previously set vertex order", TQualifier::getVertexOrderString(publicType.shaderQualifiers.order), "");
        } else
            error(loc, "can only apply to 'in'", TQualifier::getVertexOrderString(publicType.shaderQualifiers.order), "");
    }
    if (publicType.shaderQualifiers.pointMode) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setPointMode();
        else
            error(loc, "can only apply to 'in'", "point_mode", "");
    }

    for (int i = 0; i < 3; ++i) {
        if (publicType.shaderQualifiers.localSizeNotDefault[i]) {
            if (publicType.qualifier.storage == EvqVaryingIn) {
                if (! intermediate.setLocalSize(i, publicType.shaderQualifiers.localSize[i]))
                    error(loc, "cannot change previously set size", "local_size", "");
                else {
                    int max = 0;
                    if (language == EShLangCompute) {
                        switch (i) {
                        case 0: max = resources.maxComputeWorkGroupSizeX; break;
                        case 1: max = resources.maxComputeWorkGroupSizeY; break;
                        case 2: max = resources.maxComputeWorkGroupSizeZ; break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max)
                            error(loc, "too large; see gl_MaxComputeWorkGroupSize", "local_size", "");
                    } else if (language == EShLangMesh) {
                        switch (i) {
                        case 0:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeX_EXT :
                                    resources.maxMeshWorkGroupSizeX_NV;
                            break;
                        case 1:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeY_EXT :
                                    resources.maxMeshWorkGroupSizeY_NV ;
                            break;
                        case 2:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxMeshWorkGroupSizeZ_EXT :
                                    resources.maxMeshWorkGroupSizeZ_NV ;
                            break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max) {
                            TString maxsErrtring = "too large, see ";
                            maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                                    "gl_MaxMeshWorkGroupSizeEXT" : "gl_MaxMeshWorkGroupSizeNV");
                            error(loc, maxsErrtring.c_str(), "local_size", "");
                        }
                    } else if (language == EShLangTask) {
                        switch (i) {
                        case 0:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeX_EXT :
                                    resources.maxTaskWorkGroupSizeX_NV;
                            break;
                        case 1:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeY_EXT:
                                    resources.maxTaskWorkGroupSizeY_NV;
                            break;
                        case 2:
                            max = extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                    resources.maxTaskWorkGroupSizeZ_EXT:
                                    resources.maxTaskWorkGroupSizeZ_NV;
                            break;
                        default: break;
                        }
                        if (intermediate.getLocalSize(i) > (unsigned int)max) {
                            TString maxsErrtring = "too large, see ";
                            maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ?
                                                    "gl_MaxTaskWorkGroupSizeEXT" : "gl_MaxTaskWorkGroupSizeNV");
                            error(loc, maxsErrtring.c_str(), "local_size", "");
                        }
                    } else {
                        assert(0);
                    }

                    // Fix the existing constant gl_WorkGroupSize with this new information.
                    TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
                    if (workGroupSize != nullptr)
                        workGroupSize->getWritableConstArray()[i].setUConst(intermediate.getLocalSize(i));
                }
            } else
                error(loc, "can only apply to 'in'", "local_size", "");
        }
        if (publicType.shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet) {
            if (publicType.qualifier.storage == EvqVaryingIn) {
                if (! intermediate.setLocalSizeSpecId(i, publicType.shaderQualifiers.localSizeSpecId[i]))
                    error(loc, "cannot change previously set size", "local_size", "");
            } else
                error(loc, "can only apply to 'in'", "local_size id", "");
            // Set the workgroup built-in variable as a specialization constant
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            if (workGroupSize != nullptr)
                workGroupSize->getWritableType().getQualifier().specConstant = true;
        }
    }

    if (publicType.shaderQualifiers.earlyFragmentTests) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setEarlyFragmentTests();
        else
            error(loc, "can only apply to 'in'", "early_fragment_tests", "");
    }
    if (publicType.shaderQualifiers.earlyAndLateFragmentTestsAMD) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setEarlyAndLateFragmentTestsAMD();
        else
            error(loc, "can only apply to 'in'", "early_and_late_fragment_tests_amd", "");
    }
    if (publicType.shaderQualifiers.postDepthCoverage) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setPostDepthCoverage();
        else
            error(loc, "can only apply to 'in'", "post_coverage_coverage", "");
    }
    if (publicType.shaderQualifiers.nonCoherentColorAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentColorAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_color_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.nonCoherentDepthAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentDepthAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_depth_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.nonCoherentStencilAttachmentReadEXT) {
        if (publicType.qualifier.storage == EvqVaryingIn)
            intermediate.setNonCoherentStencilAttachmentReadEXT();
        else
            error(loc, "can only apply to 'in'", "non_coherent_stencil_attachment_readEXT", "");
    }
    if (publicType.shaderQualifiers.hasBlendEquation()) {
        if (publicType.qualifier.storage != EvqVaryingOut)
            error(loc, "can only apply to 'out'", "blend equation", "");
    }
    if (publicType.shaderQualifiers.interlockOrdering) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (!intermediate.setInterlockOrdering(publicType.shaderQualifiers.interlockOrdering))
                error(loc, "cannot change previously set fragment shader interlock ordering", TQualifier::getInterlockOrderingString(publicType.shaderQualifiers.interlockOrdering), "");
        }
        else
            error(loc, "can only apply to 'in'", TQualifier::getInterlockOrderingString(publicType.shaderQualifiers.interlockOrdering), "");
    }

    if (publicType.shaderQualifiers.layoutDerivativeGroupQuads &&
        publicType.shaderQualifiers.layoutDerivativeGroupLinear) {
        error(loc, "cannot be both specified", "derivative_group_quadsNV and derivative_group_linearNV", "");
    }

    if (publicType.shaderQualifiers.layoutDerivativeGroupQuads) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if ((intermediate.getLocalSizeSpecId(0) == TQualifier::layoutNotSet && (intermediate.getLocalSize(0) & 1)) ||
                (intermediate.getLocalSizeSpecId(1) == TQualifier::layoutNotSet && (intermediate.getLocalSize(1) & 1)))
                error(loc, "requires local_size_x and local_size_y to be multiple of two", "derivative_group_quadsNV", "");
            else
                intermediate.setLayoutDerivativeMode(LayoutDerivativeGroupQuads);
        }
        else
            error(loc, "can only apply to 'in'", "derivative_group_quadsNV", "");
    }
    if (publicType.shaderQualifiers.layoutDerivativeGroupLinear) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            if (intermediate.getLocalSizeSpecId(0) == TQualifier::layoutNotSet &&
                intermediate.getLocalSizeSpecId(1) == TQualifier::layoutNotSet &&
                intermediate.getLocalSizeSpecId(2) == TQualifier::layoutNotSet &&
                (intermediate.getLocalSize(0) *
                intermediate.getLocalSize(1) *
                intermediate.getLocalSize(2)) % 4 != 0)
                error(loc, "requires total group size to be multiple of four", "derivative_group_linearNV", "");
            else
                intermediate.setLayoutDerivativeMode(LayoutDerivativeGroupLinear);
        }
        else
            error(loc, "can only apply to 'in'", "derivative_group_linearNV", "");
    }
    // Check mesh out array sizes, once all the necessary out qualifiers are defined.
    if ((language == EShLangMesh) &&
        (intermediate.getVertices() != TQualifier::layoutNotSet) &&
        (intermediate.getPrimitives() != TQualifier::layoutNotSet) &&
        (intermediate.getOutputPrimitive() != ElgNone))
    {
        checkIoArraysConsistency(loc);
    }

    if (publicType.shaderQualifiers.layoutPrimitiveCulling) {
        if (publicType.qualifier.storage != EvqTemporary)
            error(loc, "layout qualifier cannot have storage qualifiers", "primitive_culling", "", "");
        else {
            intermediate.setLayoutPrimitiveCulling();
        }
        // Exit early as further checks are not valid
        return;
    }

    const TQualifier& qualifier = publicType.qualifier;

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.precision != EpqNone)
        error(loc, "cannot use auxiliary, memory, interpolation, or precision qualifier in a default qualifier declaration (declaration with no type)", "qualifier", "");

    // "The offset qualifier can only be used on block members of blocks..."
    // "The align qualifier can only be used on blocks or block members..."
    if (qualifier.hasOffset() ||
        qualifier.hasAlign())
        error(loc, "cannot use offset or align qualifiers in a default qualifier declaration (declaration with no type)", "layout qualifier", "");

    layoutQualifierCheck(loc, qualifier);

    switch (qualifier.storage) {
    case EvqUniform:
        if (qualifier.hasMatrix())
            globalUniformDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalUniformDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqBuffer:
        if (qualifier.hasMatrix())
            globalBufferDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalBufferDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqVaryingIn:
        break;
    case EvqVaryingOut:
        if (qualifier.hasStream())
            globalOutputDefaults.layoutStream = qualifier.layoutStream;
        if (qualifier.hasXfbBuffer())
            globalOutputDefaults.layoutXfbBuffer = qualifier.layoutXfbBuffer;
        if (globalOutputDefaults.hasXfbBuffer() && qualifier.hasXfbStride()) {
            if (! intermediate.setXfbBufferStride(globalOutputDefaults.layoutXfbBuffer, qualifier.layoutXfbStride))
                error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d", qualifier.layoutXfbBuffer);
        }
        break;
    case EvqShared:
        if (qualifier.hasMatrix())
            globalSharedDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalSharedDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    default:
        error(loc, "default qualifier requires 'uniform', 'buffer', 'in', 'out' or 'shared' storage qualification", "", "");
        return;
    }

    if (qualifier.hasBinding())
        error(loc, "cannot declare a default, include a type or full declaration", "binding", "");
    if (qualifier.hasAnyLocation())
        error(loc, "cannot declare a default, use a full declaration", "location/component/index", "");
    if (qualifier.hasXfbOffset())
        error(loc, "cannot declare a default, use a full declaration", "xfb_offset", "");
    if (qualifier.isPushConstant())
        error(loc, "cannot declare a default, can only be used on a block", "push_constant", "");
    if (qualifier.hasBufferReference())
        error(loc, "cannot declare a default, can only be used on a block", "buffer_reference", "");
    if (qualifier.hasSpecConstantId())
        error(loc, "cannot declare a default, can only be used on a scalar", "constant_id", "");
    if (qualifier.isShaderRecord())
        error(loc, "cannot declare a default, can only be used on a block", "shaderRecordNV", "");
}